

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  FuncType *pFVar1;
  Index IVar2;
  FuncType *pFVar3;
  
  IVar2 = BindingHash::FindIndex(&this->type_bindings,var);
  if ((ulong)IVar2 < (ulong)(*(long *)&this->field_0xf0 - *(long *)&this->types >> 3)) {
    pFVar1 = *(FuncType **)(*(long *)&this->types + (ulong)IVar2 * 8);
    pFVar3 = (FuncType *)0x0;
    if (*(int *)(pFVar1 + 0x48) == 0) {
      pFVar3 = pFVar1;
    }
  }
  else {
    pFVar3 = (FuncType *)0x0;
  }
  return pFVar3;
}

Assistant:

FuncType* Module::GetFuncType(const Var& var) {
  Index index = type_bindings.FindIndex(var);
  if (index >= types.size()) {
    return nullptr;
  }
  return dyn_cast<FuncType>(types[index]);
}